

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

_Bool finalize_p2wpkh(wally_psbt_input *input)

{
  wally_map_item *pwVar1;
  _Bool _Var2;
  int iVar3;
  wally_map_item *sig;
  wally_psbt_input *input_local;
  
  if ((input->signatures).num_items == 1) {
    pwVar1 = (input->signatures).items;
    iVar3 = wally_witness_p2wpkh_from_der
                      (pwVar1->key,pwVar1->key_len,pwVar1->value,pwVar1->value_len,
                       &input->final_witness);
    if (iVar3 == 0) {
      if (input->redeem_script == (uchar *)0x0) {
        _Var2 = true;
      }
      else {
        _Var2 = finalize_p2sh_wrapped(input);
      }
      input_local._7_1_ = _Var2 != false;
    }
    else {
      input_local._7_1_ = false;
    }
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

static bool finalize_p2wpkh(struct wally_psbt_input *input)
{
    const struct wally_map_item *sig;

    if (input->signatures.num_items != 1)
        return false; /* Must be single key, single sig */

    sig = &input->signatures.items[0];

    if (wally_witness_p2wpkh_from_der(sig->key, sig->key_len,
                                      sig->value, sig->value_len,
                                      &input->final_witness) != WALLY_OK)
        return false;

    return input->redeem_script ? finalize_p2sh_wrapped(input) : true;
}